

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::literal_char(spec *s)

{
  non_ascii *in_RDI;
  non_ascii *this;
  non_ascii *args_3;
  character_in_range *args_2;
  character_in_range *args_1;
  character *in_stack_ffffffffffffff88;
  either *in_stack_ffffffffffffff90;
  character_in_range local_68 [2];
  char_type local_40 [8];
  spec *in_stack_ffffffffffffffc8;
  scanner_base in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  character::character((character *)in_RDI,(char_type)((ulong)in_RDI >> 0x38));
  args_3 = (non_ascii *)&stack0xffffffffffffffd0;
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ulong)in_RDI >> 0x38),
             (char_type)((ulong)in_RDI >> 0x30));
  args_2 = (character_in_range *)&local_68[2].from_;
  character_in_range::character_in_range
            ((character_in_range *)this,(char_type)((ulong)in_RDI >> 0x38),
             (char_type)((ulong)in_RDI >> 0x30));
  args_1 = local_68;
  non_ascii::non_ascii
            ((non_ascii *)in_stack_ffffffffffffffd0._vptr_scanner_base,in_stack_ffffffffffffffc8);
  either::
  either<toml::detail::character,toml::detail::character_in_range,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,args_1,args_2,args_3);
  non_ascii::~non_ascii(this);
  character_in_range::~character_in_range((character_in_range *)0x6dc027);
  character_in_range::~character_in_range((character_in_range *)0x6dc031);
  character::~character((character *)0x6dc03e);
  return (either *)in_RDI;
}

Assistant:

TOML11_INLINE either literal_char(const spec& s)
{
    return either(
            character         (0x09),
            character_in_range(0x20, 0x26),
            character_in_range(0x28, 0x7E),
            non_ascii(s)
        );
}